

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_RenderingVenue.cpp
# Opt level: O3

void __thiscall soul::TaskThread::Queue::addTask(Queue *this,TaskFunction *task)

{
  int iVar1;
  tuple<soul::TaskThread::Queue::TaskHolder_*,_std::default_delete<soul::TaskThread::Queue::TaskHolder>_>
  in_RAX;
  pointer *__ptr;
  __uniq_ptr_impl<soul::TaskThread::Queue::TaskHolder,_std::default_delete<soul::TaskThread::Queue::TaskHolder>_>
  local_28;
  
  local_28._M_t.
  super__Tuple_impl<0UL,_soul::TaskThread::Queue::TaskHolder_*,_std::default_delete<soul::TaskThread::Queue::TaskHolder>_>
  .super__Head_base<0UL,_soul::TaskThread::Queue::TaskHolder_*,_false>._M_head_impl =
       (tuple<soul::TaskThread::Queue::TaskHolder_*,_std::default_delete<soul::TaskThread::Queue::TaskHolder>_>
        )(tuple<soul::TaskThread::Queue::TaskHolder_*,_std::default_delete<soul::TaskThread::Queue::TaskHolder>_>
          )in_RAX.
           super__Tuple_impl<0UL,_soul::TaskThread::Queue::TaskHolder_*,_std::default_delete<soul::TaskThread::Queue::TaskHolder>_>
           .super__Head_base<0UL,_soul::TaskThread::Queue::TaskHolder_*,_false>._M_head_impl;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->taskListLock);
  if (iVar1 == 0) {
    if ((this->ownerThread->shuttingDown).super___atomic_base<int>._M_i == 0) {
      local_28._M_t.
      super__Tuple_impl<0UL,_soul::TaskThread::Queue::TaskHolder_*,_std::default_delete<soul::TaskThread::Queue::TaskHolder>_>
      .super__Head_base<0UL,_soul::TaskThread::Queue::TaskHolder_*,_false>._M_head_impl =
           (tuple<soul::TaskThread::Queue::TaskHolder_*,_std::default_delete<soul::TaskThread::Queue::TaskHolder>_>
            )operator_new(0x28);
      *(_Manager_type *)
       ((long)local_28._M_t.
              super__Tuple_impl<0UL,_soul::TaskThread::Queue::TaskHolder_*,_std::default_delete<soul::TaskThread::Queue::TaskHolder>_>
              .super__Head_base<0UL,_soul::TaskThread::Queue::TaskHolder_*,_false>._M_head_impl +
       0x10) = (_Manager_type)0x0;
      *(_Invoker_type *)
       ((long)local_28._M_t.
              super__Tuple_impl<0UL,_soul::TaskThread::Queue::TaskHolder_*,_std::default_delete<soul::TaskThread::Queue::TaskHolder>_>
              .super__Head_base<0UL,_soul::TaskThread::Queue::TaskHolder_*,_false>._M_head_impl +
       0x18) = (_Invoker_type)0x0;
      *(undefined8 *)
       local_28._M_t.
       super__Tuple_impl<0UL,_soul::TaskThread::Queue::TaskHolder_*,_std::default_delete<soul::TaskThread::Queue::TaskHolder>_>
       .super__Head_base<0UL,_soul::TaskThread::Queue::TaskHolder_*,_false>._M_head_impl = 0;
      *(undefined8 *)
       ((long)local_28._M_t.
              super__Tuple_impl<0UL,_soul::TaskThread::Queue::TaskHolder_*,_std::default_delete<soul::TaskThread::Queue::TaskHolder>_>
              .super__Head_base<0UL,_soul::TaskThread::Queue::TaskHolder_*,_false>._M_head_impl + 8)
           = 0;
      *(undefined8 *)
       &(((function<void_(std::atomic<int>_&)> *)
         ((long)local_28._M_t.
                super__Tuple_impl<0UL,_soul::TaskThread::Queue::TaskHolder_*,_std::default_delete<soul::TaskThread::Queue::TaskHolder>_>
                .super__Head_base<0UL,_soul::TaskThread::Queue::TaskHolder_*,_false>._M_head_impl +
         0x20))->super__Function_base)._M_functor = 0;
      std::function<void_(std::atomic<int>_&)>::operator=
                ((function<void_(std::atomic<int>_&)> *)
                 local_28._M_t.
                 super__Tuple_impl<0UL,_soul::TaskThread::Queue::TaskHolder_*,_std::default_delete<soul::TaskThread::Queue::TaskHolder>_>
                 .super__Head_base<0UL,_soul::TaskThread::Queue::TaskHolder_*,_false>._M_head_impl,
                 task);
      std::
      vector<std::unique_ptr<soul::TaskThread::Queue::TaskHolder,std::default_delete<soul::TaskThread::Queue::TaskHolder>>,std::allocator<std::unique_ptr<soul::TaskThread::Queue::TaskHolder,std::default_delete<soul::TaskThread::Queue::TaskHolder>>>>
      ::
      emplace_back<std::unique_ptr<soul::TaskThread::Queue::TaskHolder,std::default_delete<soul::TaskThread::Queue::TaskHolder>>>
                ((vector<std::unique_ptr<soul::TaskThread::Queue::TaskHolder,std::default_delete<soul::TaskThread::Queue::TaskHolder>>,std::allocator<std::unique_ptr<soul::TaskThread::Queue::TaskHolder,std::default_delete<soul::TaskThread::Queue::TaskHolder>>>>
                  *)&this->tasks,
                 (unique_ptr<soul::TaskThread::Queue::TaskHolder,_std::default_delete<soul::TaskThread::Queue::TaskHolder>_>
                  *)&local_28);
      std::condition_variable::notify_all();
      if (local_28._M_t.
          super__Tuple_impl<0UL,_soul::TaskThread::Queue::TaskHolder_*,_std::default_delete<soul::TaskThread::Queue::TaskHolder>_>
          .super__Head_base<0UL,_soul::TaskThread::Queue::TaskHolder_*,_false>._M_head_impl !=
          (_Tuple_impl<0UL,_soul::TaskThread::Queue::TaskHolder_*,_std::default_delete<soul::TaskThread::Queue::TaskHolder>_>
           )0x0) {
        std::default_delete<soul::TaskThread::Queue::TaskHolder>::operator()
                  ((default_delete<soul::TaskThread::Queue::TaskHolder> *)&local_28,
                   (TaskHolder *)
                   local_28._M_t.
                   super__Tuple_impl<0UL,_soul::TaskThread::Queue::TaskHolder_*,_std::default_delete<soul::TaskThread::Queue::TaskHolder>_>
                   .super__Head_base<0UL,_soul::TaskThread::Queue::TaskHolder_*,_false>._M_head_impl
                  );
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->taskListLock);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void addTask (TaskFunction&& task)
        {
            std::lock_guard<std::mutex> l (taskListLock);

            if (ownerThread.shuttingDown)
                return;

            auto taskHolder = std::make_unique<TaskHolder>();
            taskHolder->function = std::move (task);
            tasks.emplace_back (std::move (taskHolder));
            ownerThread.checkQueues.notify_all();
        }